

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O3

void __thiscall Monitor::start(Monitor *this)

{
  thread local_28;
  Monitor *local_20;
  code *local_18;
  undefined8 local_10;
  
  local_18 = loop;
  local_10 = 0;
  local_20 = this;
  std::thread::thread<void(Monitor::*)(),Monitor*,void>
            (&local_28,(offset_in_Monitor_to_subr *)&local_18,&local_20);
  if ((this->thread_)._M_id._M_thread == 0) {
    (this->thread_)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    pthread_setname_np((pthread_t)local_28._M_id._M_thread,"monitor");
    return;
  }
  std::terminate();
}

Assistant:

void Monitor::start() {
  thread_ = std::thread(&Monitor::loop, this);
#ifdef __APPLE__
  pthread_setname_np("monitor");
#else
  pthread_setname_np(thread_.native_handle(), "monitor");
#endif
}